

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::StencilTestInstance::iterate
          (TestStatus *__return_storage_ptr__,StencilTestInstance *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float *pfVar3;
  TestLog *log;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  VkResult VVar8;
  deUint32 queueFamilyIndex;
  DeviceInterface *pDVar9;
  VkDevice pVVar10;
  VkQueue pVVar11;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  long lVar12;
  int *piVar13;
  ulong uVar14;
  UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  TextureFormat tcuStencilFormat;
  TextureFormat tcuColorFormat;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> cwVertices;
  IVec3 local_604;
  undefined1 *local_5f8;
  undefined1 *puStack_5f0;
  ColorVertexShader vertexShader;
  RenderState renderState;
  Program program;
  ColorFragmentShader fragmentShader;
  ReferenceRenderer refRenderer;
  Vertex4RGBA cwVertex1;
  VkSubmitInfo submitInfo;
  
  pDVar9 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar10 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar11 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&this->m_cmdBuffer;
  VVar8 = (*pDVar9->_vptr_DeviceInterface[0x14])(pDVar9,pVVar10,1,&this->m_fence);
  ::vk::checkResult(VVar8,"vk.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineStencilTests.cpp"
                    ,0x37f);
  VVar8 = (*pDVar9->_vptr_DeviceInterface[2])
                    (pDVar9,pVVar11,1,&submitInfo,
                     (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                     m_internal);
  ::vk::checkResult(VVar8,"vk.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineStencilTests.cpp"
                    ,0x380);
  VVar8 = (*pDVar9->_vptr_DeviceInterface[0x16])
                    (pDVar9,pVVar10,1,&this->m_fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar8,"vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineStencilTests.cpp"
                    ,0x381);
  tcuColorFormat = ::vk::mapVkFormat(this->m_colorFormat);
  tcuStencilFormat = ::vk::mapVkFormat(this->m_stencilFormat);
  ColorVertexShader::ColorVertexShader((ColorVertexShader *)&vertexShader.super_VertexShader);
  ColorFragmentShader::ColorFragmentShader(&fragmentShader,&tcuColorFormat,&tcuStencilFormat);
  program.geometryShader = (GeometryShader *)0x0;
  program.vertexShader = &vertexShader.super_VertexShader;
  program.fragmentShader = &fragmentShader.super_FragmentShader;
  ReferenceRenderer::ReferenceRenderer
            (&refRenderer,(this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],1,
             &tcuColorFormat,&tcuStencilFormat,&program);
  ReferenceRenderer::getViewportState(&refRenderer);
  rr::RenderState::RenderState
            (&renderState,(ViewportState *)&cwVertex1,VIEWPORTORIENTATION_LOWER_LEFT);
  renderState.fragOps.depthTestEnabled = true;
  renderState.fragOps.depthFunc = mapVkCompareOp(VK_COMPARE_OP_LESS);
  renderState.fragOps.stencilTestEnabled = true;
  renderState.fragOps.stencilStates[0].sFail = mapVkStencilOp((this->m_stencilOpStateFront).failOp);
  renderState.fragOps.stencilStates[0].dpFail =
       mapVkStencilOp((this->m_stencilOpStateFront).depthFailOp);
  renderState.fragOps.stencilStates[0].dpPass = mapVkStencilOp((this->m_stencilOpStateFront).passOp)
  ;
  renderState.fragOps.stencilStates[0].func =
       mapVkCompareOp((this->m_stencilOpStateFront).compareOp);
  renderState.fragOps.stencilStates[1].sFail = mapVkStencilOp((this->m_stencilOpStateBack).failOp);
  renderState.fragOps.stencilStates[1].dpFail =
       mapVkStencilOp((this->m_stencilOpStateBack).depthFailOp);
  renderState.fragOps.stencilStates[1].dpPass = mapVkStencilOp((this->m_stencilOpStateBack).passOp);
  renderState.fragOps.stencilStates[1].func = mapVkCompareOp((this->m_stencilOpStateBack).compareOp)
  ;
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
            (&cwVertices,&this->m_vertices);
  lVar12 = 0x20;
  for (uVar14 = 0;
      uVar14 < ((long)cwVertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)cwVertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) - 2U; uVar14 = uVar14 + 3) {
    Vertex4RGBA::Vertex4RGBA
              (&cwVertex1,
               (Vertex4RGBA *)
               ((long)((cwVertices.
                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        ._M_impl.super__Vector_impl_data._M_start)->position).m_data + lVar12));
    puVar1 = (undefined8 *)
             ((long)cwVertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].position.m_data + lVar12);
    uVar4 = *puVar1;
    uVar5 = puVar1[1];
    puVar1 = (undefined8 *)
             ((long)cwVertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].color.m_data + lVar12);
    uVar6 = puVar1[1];
    puVar2 = (undefined8 *)
             ((long)((cwVertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_start)->color).m_data + lVar12);
    *puVar2 = *puVar1;
    puVar2[1] = uVar6;
    puVar1 = (undefined8 *)
             ((long)((cwVertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_start)->position).m_data + lVar12);
    *puVar1 = uVar4;
    puVar1[1] = uVar5;
    pfVar3 = (float *)((long)cwVertices.
                             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].position.m_data + lVar12);
    *(undefined8 *)pfVar3 = cwVertex1.position.m_data._0_8_;
    *(undefined8 *)(pfVar3 + 2) = cwVertex1.position.m_data._8_8_;
    pfVar3 = (float *)((long)cwVertices.
                             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].color.m_data + lVar12);
    *(undefined8 *)pfVar3 = cwVertex1.color.m_data._0_8_;
    *(undefined8 *)(pfVar3 + 2) = cwVertex1.color.m_data._8_8_;
    lVar12 = lVar12 + 0x60;
  }
  piVar13 = &DAT_00984a84;
  for (lVar12 = 0xc0; lVar12 != 0x3c0; lVar12 = lVar12 + 0xc0) {
    renderState.fragOps.stencilStates[0].ref = piVar13[-3];
    renderState.fragOps.stencilStates[0].compMask = piVar13[-5];
    renderState.fragOps.stencilStates[0].writeMask = piVar13[-4];
    renderState.fragOps.stencilStates[1].ref = *piVar13;
    renderState.fragOps.stencilStates[1].compMask = piVar13[-2];
    renderState.fragOps.stencilStates[1].writeMask = piVar13[-1];
    std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
    vector<__gnu_cxx::__normal_iterator<vkt::pipeline::Vertex4RGBA*,std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>>,void>
              ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
               &cwVertex1,
               (Vertex4RGBA *)
               ((long)cwVertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_start[-6].position.m_data + lVar12),
               (Vertex4RGBA *)
               ((long)((cwVertices.
                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        ._M_impl.super__Vector_impl_data._M_start)->position).m_data + lVar12),
               (allocator_type *)&result);
    ReferenceRenderer::draw
              (&refRenderer,&renderState,PRIMITIVETYPE_TRIANGLES,
               (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               &cwVertex1);
    std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
    ~_Vector_base((_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                   *)&cwVertex1);
    piVar13 = piVar13 + 6;
  }
  std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
  ~_Vector_base(&cwVertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               );
  pDVar9 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar10 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar11 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  vk = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&cwVertex1,vk,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            ((SimpleAllocator *)&renderState,pDVar9,pVVar10,
             (VkPhysicalDeviceMemoryProperties *)&cwVertex1);
  readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      &cwVertex1,pDVar9,pVVar10,pVVar11,queueFamilyIndex,(Allocator *)&renderState,
                      (VkImage)(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                               m_data.object.m_internal,this->m_colorFormat,&this->m_renderSize);
  uVar4 = cwVertex1.position.m_data._0_8_;
  cwVertex1.position.m_data[0] = 0.0;
  cwVertex1.position.m_data[1] = 0.0;
  result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       (TextureLevel *)uVar4;
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~UniqueBase
            ((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&cwVertex1);
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ReferenceRenderer::getAccess((PixelBufferAccess *)&cwVertex1,&refRenderer);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&cwVertices,(TextureLevel *)uVar4);
  local_5f8 = &DAT_200000002;
  puStack_5f0 = &DAT_200000002;
  local_604.m_data[0] = 1;
  local_604.m_data[1] = 1;
  local_604.m_data[2] = 0;
  bVar7 = tcu::intThresholdPositionDeviationCompare
                    (log,"IntImageCompare","Image comparison",(ConstPixelBufferAccess *)&cwVertex1,
                     (ConstPixelBufferAccess *)&cwVertices,(UVec4 *)&local_5f8,&local_604,true,
                     COMPARE_LOG_RESULT);
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~UniqueBase
            (&result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  if (bVar7) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&renderState,"Result image matches reference",(allocator<char> *)&cwVertex1
              );
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&renderState);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&renderState,"Image mismatch",(allocator<char> *)&cwVertex1);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&renderState);
  }
  std::__cxx11::string::~string((string *)&renderState);
  ReferenceRenderer::~ReferenceRenderer(&refRenderer);
  rr::FragmentShader::~FragmentShader(&fragmentShader.super_FragmentShader);
  rr::VertexShader::~VertexShader(&vertexShader.super_VertexShader);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus StencilTestInstance::iterate (void)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();
	const VkSubmitInfo			submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,						// const void*				pNext;
		0u,								// deUint32					waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
		(const VkPipelineStageFlags*)DE_NULL,
		1u,								// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
		0u,								// deUint32					signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*		pSignalSemaphores;
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity*/));

	return verifyImage();
}